

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * parse_function_body(dmr_C *C,token *token,symbol *decl,symbol_list **list)

{
  parse_state_t *ppVar1;
  position pVar2;
  symbol *psVar3;
  symbol_list **listp;
  unsigned_long uVar4;
  context_list *pcVar5;
  uint uVar6;
  undefined4 uVar7;
  char *pcVar8;
  ulong uVar9;
  undefined4 *puVar10;
  symbol *sym;
  symbol *psVar11;
  token *ptVar12;
  void *pvVar13;
  ulong uVar14;
  undefined1 local_68 [8];
  ptr_list_iter argiter__;
  
  psVar11 = (decl->field_14).field_2.ctype.base_type;
  ppVar1 = C->P;
  argiter__._16_8_ = ppVar1->function_symbol_list;
  uVar14 = (ulong)(*(uint *)((long)&decl->field_14 + 0x18) >> 0xe & 0x10);
  ppVar1->function_symbol_list = (symbol_list **)((long)&decl->field_14 + uVar14 + 0x50);
  ppVar1->function_computed_target_list = (symbol_list *)0x0;
  ppVar1->function_computed_goto_list = (statement_list *)0x0;
  uVar9 = (decl->field_14).field_2.ctype.modifiers;
  if (((uint)uVar9 & 0x40008) == 8) {
    pcVar8 = dmrC_show_ident(C,decl->ident);
    dmrC_warning(C,decl->pos,"function \'%s\' with external linkage has definition",pcVar8);
    uVar9 = (decl->field_14).field_2.ctype.modifiers;
  }
  if ((uVar9 & 4) == 0) {
    (decl->field_14).field_2.ctype.modifiers = uVar9 | 8;
  }
  pVar2 = decl->pos;
  puVar10 = (undefined4 *)dmrC_allocator_allocate(&C->statement_allocator,0);
  *puVar10 = 3;
  *(position *)(puVar10 + 1) = pVar2;
  dmrC_start_function_scope(C);
  sym = dmrC_alloc_symbol(C->S,decl->pos,3);
  psVar3 = (decl->field_14).field_2.ctype.base_type;
  uVar4 = (psVar3->field_14).field_2.ctype.alignment;
  pcVar5 = (psVar3->field_14).field_2.ctype.contexts;
  uVar6 = *(uint *)((long)&psVar3->field_14 + 0x30);
  uVar7 = *(undefined4 *)((long)&psVar3->field_14 + 0x34);
  (sym->field_14).field_2.ctype.modifiers = (psVar3->field_14).field_2.ctype.modifiers;
  (sym->field_14).field_2.ctype.alignment = uVar4;
  (sym->field_14).field_2.ctype.contexts = pcVar5;
  *(uint *)((long)&sym->field_14 + 0x30) = uVar6;
  *(undefined4 *)((long)&sym->field_14 + 0x34) = uVar7;
  (sym->field_14).field_2.ctype.base_type = (psVar3->field_14).field_2.ctype.base_type;
  (sym->field_14).field_2.ctype.modifiers =
       (sym->field_14).field_2.ctype.modifiers & 0xffffffffff01ffc0 | 3;
  dmrC_bind_symbol(C->S,sym,C->S->return_ident,NS_ITERATOR);
  *(symbol **)(puVar10 + 6) = sym;
  listp = C->P->function_symbol_list;
  if (listp != (symbol_list **)0x0) {
    ptrlist_add((ptr_list **)listp,sym,&C->ptrlist_allocator);
  }
  C->current_fn = decl;
  *(undefined4 **)((long)&psVar11->field_14 + uVar14 + 0x48) = puVar10;
  ptrlist_forward_iterator
            ((ptr_list_iter *)local_68,(ptr_list *)(psVar11->field_14).field_2.arguments);
  psVar11 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_68);
  if (psVar11 != (symbol *)0x0) {
    do {
      if (psVar11->ident == (ident *)0x0) {
        dmrC_sparse_error(C,psVar11->pos,"no identifier for function argument");
      }
      else {
        dmrC_bind_symbol(C->S,psVar11,psVar11->ident,NS_SYMBOL);
      }
      psVar11 = (symbol *)ptrlist_iter_next((ptr_list_iter *)local_68);
    } while (psVar11 != (symbol *)0x0);
  }
  ptVar12 = statement_list(C,token->next,(statement_list **)(puVar10 + 4));
  C->current_fn = (symbol *)0x0;
  dmrC_end_function_scope(C);
  if ((*(byte *)((long)&decl->field_14 + 0x1a) & 4) == 0) {
    ptrlist_add((ptr_list **)list,decl,&C->ptrlist_allocator);
  }
  dmrC_check_declaration(C->S,decl);
  (decl->field_14).field_2.definition = decl;
  psVar11 = (decl->field_12).same_symbol;
  if (psVar11 != (symbol *)0x0) {
    if ((psVar11->field_14).field_2.definition == (symbol *)0x0) {
      do {
        dmrC_rebind_scope(C,psVar11,decl->scope);
        (psVar11->field_14).field_2.definition = decl;
        psVar11 = (psVar11->field_12).same_symbol;
      } while (psVar11 != (symbol *)0x0);
    }
    else {
      pcVar8 = dmrC_show_ident(C,decl->ident);
      dmrC_warning(C,decl->pos,"multiple definitions for function \'%s\'",pcVar8);
      dmrC_info(C,((psVar11->field_14).field_2.definition)->pos," the previous one is here");
    }
  }
  ppVar1 = C->P;
  ppVar1->function_symbol_list = (symbol_list **)argiter__._16_8_;
  if (ppVar1->function_computed_goto_list != (statement_list *)0x0) {
    if (ppVar1->function_computed_target_list == (symbol_list *)0x0) {
      pcVar8 = dmrC_show_ident(C,decl->ident);
      dmrC_warning(C,decl->pos,"function \'%s\' has computed goto but no targets?",pcVar8);
    }
    else {
      ptrlist_forward_iterator
                ((ptr_list_iter *)local_68,(ptr_list *)ppVar1->function_computed_goto_list);
      while( true ) {
        pvVar13 = ptrlist_iter_next((ptr_list_iter *)local_68);
        if (pvVar13 == (void *)0x0) break;
        *(symbol_list **)((long)pvVar13 + 0x20) = C->P->function_computed_target_list;
      }
    }
  }
  ptVar12 = dmrC_expect_token(C,ptVar12,0x7d,"at end of function");
  return ptVar12;
}

Assistant:

static struct token *parse_function_body(struct dmr_C *C, struct token *token, struct symbol *decl,
	struct symbol_list **list)
{
	struct symbol_list **old_symbol_list;
	struct symbol *base_type = decl->ctype.base_type;
	struct statement *stmt, **p;
	struct symbol *prev;
	struct symbol *arg;

	old_symbol_list = C->P->function_symbol_list;
	if (decl->ctype.modifiers & MOD_INLINE) {
		C->P->function_symbol_list = &decl->inline_symbol_list;
		p = &base_type->inline_stmt;
	} else {
		C->P->function_symbol_list = &decl->symbol_list;
		p = &base_type->stmt;
	}
	C->P->function_computed_target_list = NULL;
	C->P->function_computed_goto_list = NULL;

	if (decl->ctype.modifiers & MOD_EXTERN) {
		if (!(decl->ctype.modifiers & MOD_INLINE))
			dmrC_warning(C, decl->pos, "function '%s' with external linkage has definition", dmrC_show_ident(C, decl->ident));
	}
	if (!(decl->ctype.modifiers & MOD_STATIC))
		decl->ctype.modifiers |= MOD_EXTERN;

	stmt = start_function(C, decl);

	*p = stmt;
	FOR_EACH_PTR (base_type->arguments, arg) {
		declare_argument(C, arg, base_type);
	} END_FOR_EACH_PTR(arg);

	token = dmrC_compound_statement(C, token->next, stmt);

	end_function(C, decl);
	if (!(decl->ctype.modifiers & MOD_INLINE))
		dmrC_add_symbol(C, list, decl);
	dmrC_check_declaration(C->S, decl);
	decl->definition = decl;
	prev = decl->same_symbol;
	if (prev && prev->definition) {
		dmrC_warning(C, decl->pos, "multiple definitions for function '%s'",
			dmrC_show_ident(C, decl->ident));
		dmrC_info(C, prev->definition->pos, " the previous one is here");
	} else {
		while (prev) {
			dmrC_rebind_scope(C, prev, decl->scope);
			prev->definition = decl;
			prev = prev->same_symbol;
		}
	}
	C->P->function_symbol_list = old_symbol_list;
	if (C->P->function_computed_goto_list) {
		if (!C->P->function_computed_target_list)
			dmrC_warning(C, decl->pos, "function '%s' has computed goto but no targets?", dmrC_show_ident(C, decl->ident));
		else {
			FOR_EACH_PTR(C->P->function_computed_goto_list, stmt) {
				stmt->target_list = C->P->function_computed_target_list;
			} END_FOR_EACH_PTR(stmt);
		}
	}
	return dmrC_expect_token(C, token, '}', "at end of function");
}